

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Attribute_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Attribute_PDU *this)

{
  pointer pAVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  pointer pAVar3;
  KStringStream ss;
  KString KStack_298;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_278,&this->super_Header);
  poVar2 = std::operator<<(local_1a8,(string *)&local_278);
  poVar2 = std::operator<<(poVar2,"-Attribute PDU-\n");
  poVar2 = std::operator<<(poVar2,"Originating Simulation Address:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_OrigSimAddr);
  UTILS::IndentString(&KStack_298,&local_1d8,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&KStack_298);
  poVar2 = std::operator<<(poVar2,"Extended PDU Type:  ");
  DATA_TYPE::ENUMS::GetEnumAsStringPDUType_abi_cxx11_
            (&local_1f8,(ENUMS *)(ulong)this->m_ui8ExtPDUType,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Protocol Version:   ");
  DATA_TYPE::ENUMS::GetEnumAsStringProtocolVersion_abi_cxx11_
            (&local_218,(ENUMS *)(ulong)this->m_ui8ExtProtocolVersion,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_218);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Master Record Type: ");
  DATA_TYPE::ENUMS::GetEnumAsStringAttributeID_abi_cxx11_
            (&local_238,(ENUMS *)(ulong)this->m_ui32MasterRecType,Value_01);
  poVar2 = std::operator<<(poVar2,(string *)&local_238);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Action Code:        ");
  DATA_TYPE::ENUMS::GetEnumAsStringActionCode_abi_cxx11_
            (&local_258,(ENUMS *)(ulong)this->m_ui8ActionCode,Value_02);
  poVar2 = std::operator<<(poVar2,(string *)&local_258);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Records:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumAttrRecSets);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"Record Sets:\n");
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&KStack_298);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_278);
  pAVar1 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pAVar3 = (this->m_vAttributeRecordSets).
                super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
                ._M_impl.super__Vector_impl_data._M_start; pAVar3 != pAVar1; pAVar3 = pAVar3 + 1) {
    (*(pAVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&KStack_298,pAVar3);
    UTILS::IndentString(&local_278,&KStack_298,Tabs_00,in_CL);
    std::operator<<(local_1a8,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&KStack_298);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString Attribute_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Attribute PDU-\n"
       << "Originating Simulation Address:\n"
       << IndentString( m_OrigSimAddr.GetAsString(), 1 )
       << "Extended PDU Type:  " << GetEnumAsStringPDUType( m_ui8ExtPDUType )                 << "\n"
       << "Protocol Version:   " << GetEnumAsStringProtocolVersion( m_ui8ExtProtocolVersion ) << "\n"
       << "Master Record Type: " << GetEnumAsStringAttributeID( m_ui32MasterRecType )         << "\n"
       << "Action Code:        " << GetEnumAsStringActionCode( m_ui8ActionCode )              << "\n"
       << "Number Of Records:  " << m_ui16NumAttrRecSets                                      << "\n"
       << "Record Sets:\n";

    vector<AttributeRecordSet>::const_iterator citr = m_vAttributeRecordSets.begin();
    vector<AttributeRecordSet>::const_iterator citrEnd = m_vAttributeRecordSets.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}